

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O3

RGB __thiscall
RayTracer::processPixelOnPlane
          (RayTracer *this,Point *rayBeg,Point *pointOnPlane,const_iterator planeIt,
          int recursionLevel)

{
  Point *light;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  pointer pPVar5;
  pointer pSVar6;
  bool bVar7;
  RGB RVar8;
  uint uVar9;
  Plane *pPVar10;
  pointer object;
  float fVar11;
  Segment local_78;
  undefined1 local_60 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  refl.b._4_8_ = rayBeg;
  for (pPVar10 = (this->super_RayTracerBase).config.planes.
                 super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                 _M_start; pPVar10 != planeIt._M_current; pPVar10 = pPVar10 + 1) {
    bVar7 = pointInShadow<Plane>(pointOnPlane,light,pPVar10);
    if (bVar7) goto LAB_001055a7;
  }
  pPVar5 = (this->super_RayTracerBase).config.planes.
           super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pPVar10 = planeIt._M_current + 1; pPVar10 != pPVar5; pPVar10 = pPVar10 + 1) {
    bVar7 = pointInShadow<Plane>(pointOnPlane,light,pPVar10);
    if (bVar7) goto LAB_001055a7;
  }
  pSVar6 = (this->super_RayTracerBase).config.spheres.
           super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (object = (this->super_RayTracerBase).config.spheres.
                super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
                _M_start; object != pSVar6; object = object + 1) {
    bVar7 = pointInShadow<Sphere>(pointOnPlane,light,object);
    if (bVar7) goto LAB_001055a7;
  }
  uVar2 = (this->super_RayTracerBase).config.super_BaseConfig.light.x;
  uVar3 = (this->super_RayTracerBase).config.super_BaseConfig.light.y;
  refl.a.x = (this->super_RayTracerBase).config.super_BaseConfig.light.z - pointOnPlane->z;
  local_60._4_4_ = (float)uVar3 - pointOnPlane->y;
  local_60._0_4_ = (float)uVar2 - pointOnPlane->x;
  RVar8 = calculateColorInLight
                    (this,(planeIt._M_current)->color,&(planeIt._M_current)->normal,
                     (Vector *)local_60);
  uVar9 = (uint)(uint3)RVar8;
LAB_0010565c:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((planeIt._M_current)->reflectionCoefficient))) {
    local_78.a.z = *(float *)(refl.b._4_8_ + 8);
    local_78.a._0_8_ = *(undefined8 *)refl.b._4_8_;
    local_78.b.x = pointOnPlane->x;
    local_78.b.y = pointOnPlane->y;
    local_78.b.z = pointOnPlane->z;
    reflection(&local_78,planeIt._M_current);
    RVar8 = processPixel(this,(Segment *)local_60,recursionLevel + 1);
    fVar1 = (planeIt._M_current)->reflectionCoefficient;
    fVar11 = 1.0 - fVar1;
    uVar9 = (uint)(byte)((char)(int)((float)((uint3)RVar8 & 0xff) * fVar1) +
                        (char)(int)((float)(uVar9 & 0xff) * fVar11)) |
            (uint)(byte)((char)(int)((float)(RVar8._1_2_ & 0xff) * fVar1) +
                        (char)(int)((float)(uVar9 >> 8 & 0xff) * fVar11)) << 8 |
            (uint)(byte)((char)(int)((float)RVar8.b * fVar1) +
                        (char)(int)((float)(uVar9 >> 0x10 & 0xff) * fVar11)) << 0x10;
  }
  return SUB43(uVar9,0);
LAB_001055a7:
  uVar4._0_1_ = ((planeIt._M_current)->color).r;
  uVar4._1_1_ = ((planeIt._M_current)->color).g;
  fVar1 = (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient;
  uVar9 = (int)((float)(uVar4 & 0xff) * fVar1) & 0xffU |
          ((int)((float)(uVar4 >> 8) * fVar1) & 0xffU) << 8 |
          (int)((float)((planeIt._M_current)->color).b * fVar1) << 0x10;
  goto LAB_0010565c;
}

Assistant:

RGB RayTracer::processPixelOnPlane(Point const& rayBeg, Point const& pointOnPlane,
                                   std::vector<Plane>::const_iterator planeIt, int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnPlane, config.light, config.planes.cbegin(), planeIt)
      || pointInShadow(pointOnPlane, config.light, planeIt + 1, config.planes.cend())
      || pointInShadow(pointOnPlane, config.light, config.spheres.cbegin(), config.spheres.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = planeIt->color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(planeIt->color, planeIt->normal, config.light - pointOnPlane);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(planeIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnPlane}, *planeIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, planeIt->reflectionCoefficient);
}